

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O3

void OutputCircularDependencies
               (Configuration *config,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
               *components,path *outfile)

{
  _Hash_node_base *p_Var1;
  ostream *poVar2;
  ulong uVar3;
  size_t sVar4;
  string *psVar5;
  _Hash_node_base *p_Var6;
  ostream *poVar7;
  char *__s;
  _Hash_node_base *p_Var8;
  OstreamHolder outHolder;
  char local_279;
  string local_278;
  string local_258;
  undefined1 local_238 [256];
  undefined8 local_138 [33];
  
  OstreamHolder::OstreamHolder((OstreamHolder *)local_238,outfile);
  if (local_238[0] == false) {
    poVar7 = (ostream *)(local_238 + 8);
  }
  else {
    poVar7 = (ostream *)&std::cout;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"digraph dependencies {",0x16);
  local_278._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_278,1);
  for (p_Var8 = (components->_M_h)._M_before_begin._M_nxt; p_Var8 != (_Hash_node_base *)0x0;
      p_Var8 = p_Var8->_M_nxt) {
    if (p_Var8[5]._M_nxt[0x27]._M_nxt != (_Hash_node_base *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
      Component::QuotedName_abi_cxx11_(&local_278,(Component *)p_Var8[5]._M_nxt);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(char *)CONCAT71(local_278._M_dataplus._M_p._1_7_,
                                                  local_278._M_dataplus._M_p._0_1_),
                          local_278._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," [shape=",8);
      p_Var6 = p_Var8[5]._M_nxt[0x33]._M_nxt;
      __s = "oval";
      if (p_Var6 != (_Hash_node_base *)0x0) {
        uVar3 = 0;
        do {
          p_Var1 = p_Var6 + 1;
          p_Var6 = p_Var6->_M_nxt;
          uVar3 = (long)&(p_Var1->_M_nxt[0x19]._M_nxt)->_M_nxt + uVar3;
        } while (p_Var6 != (_Hash_node_base *)0x0);
        __s = "oval";
        if ((((999 < uVar3) && (__s = "doublecircle", 4999 < uVar3)) &&
            (__s = "octagon", 19999 < uVar3)) && (__s = "tripleoctagon", uVar3 < 50000)) {
          __s = "doubleoctagon";
        }
      }
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"];\n",3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_278._M_dataplus._M_p._1_7_,local_278._M_dataplus._M_p._0_1_) !=
          &local_278.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_278._M_dataplus._M_p._1_7_,local_278._M_dataplus._M_p._0_1_))
        ;
      }
      for (p_Var6 = p_Var8[5]._M_nxt[0x26]._M_nxt; p_Var6 != (_Hash_node_base *)0x0;
          p_Var6 = p_Var6->_M_nxt) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
        Component::QuotedName_abi_cxx11_(&local_278,(Component *)p_Var8[5]._M_nxt);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(char *)CONCAT71(local_278._M_dataplus._M_p._1_7_,
                                                    local_278._M_dataplus._M_p._0_1_),
                            local_278._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," -> ",4);
        Component::QuotedName_abi_cxx11_(&local_258,(Component *)p_Var6[1]._M_nxt);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,local_258._M_dataplus._M_p,local_258._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," [color=",8);
        psVar5 = getLinkColor_abi_cxx11_
                           (config,(Component *)p_Var8[5]._M_nxt,(Component *)p_Var6[1]._M_nxt);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"];",2);
        local_279 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_279,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_278._M_dataplus._M_p._1_7_,local_278._M_dataplus._M_p._0_1_) !=
            &local_278.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_278._M_dataplus._M_p._1_7_,local_278._M_dataplus._M_p._0_1_
                                  ));
        }
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
  local_278._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_278,1);
  local_238._8_8_ =
       std::ofstream-in-boost::filesystem::basic_ofstream<char,std::char_traits<char>>::
       construction_vtable + 0x18;
  local_138[0] = 0x137d18;
  std::filebuf::~filebuf((filebuf *)(local_238 + 0x10));
  std::ios_base::~ios_base((ios_base *)local_138);
  return;
}

Assistant:

void OutputCircularDependencies(const Configuration& config, std::unordered_map<std::string, Component *> &components,
                                const filesystem::path &outfile) {
    OstreamHolder outHolder(outfile);
    std::ostream& out = outHolder.get();
    out << "digraph dependencies {" << '\n';
    for (const auto &c : components) {
        if (c.second->circulars.empty()) {
            continue;
        }

        out << "  " << c.second->QuotedName() << " [shape=" << getShapeForSize(c.second) << "];\n";

        for (const auto &t : c.second->circulars) {
            out << "  " << c.second->QuotedName() << " -> " << t->QuotedName() << " [color="
                << getLinkColor(config, c.second, t) << "];" << '\n';
        }
    }
    out << "}" << '\n';
}